

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EmitTypeOfFld
          (ByteCodeGenerator *this,FuncInfo *funcInfo,PropertyId propertyId,RegSlot value,
          RegSlot instance,OpCode ldFldOp,bool reuseLoc)

{
  OpCode op;
  RegSlot value_00;
  uint uVar1;
  ByteCodeWriter *pBVar2;
  RegSlot tmpReg;
  uint cacheId;
  bool reuseLoc_local;
  OpCode ldFldOp_local;
  RegSlot instance_local;
  RegSlot value_local;
  PropertyId propertyId_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  value_00 = FuncInfo::AcquireTmpRegister(funcInfo);
  if (ldFldOp != LdLocalFld) {
    if (ldFldOp == LdRootFldForTypeOf) {
      uVar1 = FuncInfo::FindOrAddRootObjectInlineCacheId(funcInfo,propertyId,false,false);
      pBVar2 = Writer(this);
      Js::ByteCodeWriter::PatchableRootProperty
                (pBVar2,LdRootFldForTypeOf,value_00,uVar1,false,false,true);
      goto LAB_00b442c7;
    }
    if (ldFldOp != ScopedLdFldForTypeOf) {
      uVar1 = FuncInfo::FindOrAddInlineCacheId(funcInfo,instance,propertyId,false,false);
      pBVar2 = Writer(this);
      Js::ByteCodeWriter::PatchableProperty(pBVar2,ldFldOp,value_00,instance,uVar1,false,true);
      goto LAB_00b442c7;
    }
  }
  uVar1 = FuncInfo::FindOrAddInlineCacheId(funcInfo,instance,propertyId,false,false);
  pBVar2 = Writer(this);
  Js::ByteCodeWriter::ElementP(pBVar2,ldFldOp,value_00,uVar1,false,true);
LAB_00b442c7:
  pBVar2 = Writer(this);
  op = Typeof;
  if (reuseLoc) {
    op = Typeof_ReuseLoc;
  }
  Js::ByteCodeWriter::Reg2(pBVar2,op,value,value_00);
  FuncInfo::ReleaseTmpRegister(funcInfo,value_00);
  return;
}

Assistant:

void ByteCodeGenerator::EmitTypeOfFld(FuncInfo * funcInfo, Js::PropertyId propertyId, Js::RegSlot value, Js::RegSlot instance, Js::OpCode ldFldOp, bool reuseLoc)
{

    uint cacheId;
    Js::RegSlot tmpReg = funcInfo->AcquireTmpRegister();
    switch (ldFldOp)
    {
    case Js::OpCode::LdRootFldForTypeOf:
        cacheId = funcInfo->FindOrAddRootObjectInlineCacheId(propertyId, false, false);
        this->Writer()->PatchableRootProperty(ldFldOp, tmpReg, cacheId, false, false);
        break;

    case Js::OpCode::LdLocalFld:
    case Js::OpCode::ScopedLdFldForTypeOf:
        cacheId = funcInfo->FindOrAddInlineCacheId(instance, propertyId, false, false);
        this->Writer()->ElementP(ldFldOp, tmpReg, cacheId);
        break;

    default:
        cacheId = funcInfo->FindOrAddInlineCacheId(instance, propertyId, false, false);
        this->Writer()->PatchableProperty(ldFldOp, tmpReg, instance, cacheId);
        break;
    }

    this->Writer()->Reg2(reuseLoc ? Js::OpCode::Typeof_ReuseLoc : Js::OpCode::Typeof, value, tmpReg);
    funcInfo->ReleaseTmpRegister(tmpReg);
}